

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::PolylineEdgeContainsVertex
          (CrossingProcessor *this,S2Point *v,CrossingIterator *it)

{
  int iVar1;
  bool bVar2;
  ChainInfo *pCVar3;
  Edge local_a0;
  S2LogMessage local_70;
  undefined1 local_60 [48];
  
  if (it->b_dimension_ != 1) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x687,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)local_a0.v0.c_[1],"Check failed: (1) == (it.b_dimension()) ");
LAB_001e63c8:
    abort();
  }
  CrossingIterator::b_edge(&local_a0,it);
  bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                    ((BasicVector<Vector3,_double,_3UL> *)&local_a0,v);
  if (!bVar2) {
    CrossingIterator::b_edge((Edge *)local_60,it);
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)(local_60 + 0x18),v);
    if (!bVar2) {
      S2LogMessage::S2LogMessage
                (&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0x688,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_70.stream_,"Check failed: it.b_edge().v0 == v || it.b_edge().v1 == v ");
      goto LAB_001e63c8;
    }
  }
  if (this->polyline_model_ == CLOSED) {
    return true;
  }
  pCVar3 = CrossingIterator::b_chain_info(it);
  iVar1 = (((it->it_)._M_current)->b).edge_id;
  if (pCVar3->limit + -1 == iVar1) {
    CrossingIterator::b_edge(&local_a0,it);
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)v,&local_a0.v1);
    if (bVar2) {
      return false;
    }
  }
  if (pCVar3->start < iVar1) {
    return true;
  }
  if (this->polyline_model_ != OPEN) {
    return true;
  }
  CrossingIterator::b_edge(&local_a0,it);
  bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)v,&local_a0.v0);
  if (!bVar2) {
    if (this->polyline_loops_have_boundaries_ != false) {
      return false;
    }
    (*it->b_shape_->_vptr_S2Shape[8])
              (&local_a0,it->b_shape_,(ulong)(uint)pCVar3->chain_id,
               (ulong)(uint)(~pCVar3->start + pCVar3->limit));
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)v,&local_a0.v1);
    return bVar2;
  }
  return true;
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::PolylineEdgeContainsVertex(
    const S2Point& v, const CrossingIterator& it) const {
  S2_DCHECK_EQ(1, it.b_dimension());
  S2_DCHECK(it.b_edge().v0 == v || it.b_edge().v1 == v);

  // Closed polylines contain all their vertices.
  if (polyline_model_ == PolylineModel::CLOSED) return true;

  // Note that the code below is structured so that it.b_edge() is not usually
  // needed (since accessing the edge can be relatively expensive).
  const auto& b_chain = it.b_chain_info();
  int b_edge_id = it.b_edge_id();

  // The last polyline vertex is never contained.  (For polyline loops, it is
  // sufficient to treat the first vertex as begin contained.)  This case also
  // handles degenerate polylines (polylines with one edge where v0 == v1),
  // which do not contain any points.
  if (b_edge_id == b_chain.limit - 1 && v == it.b_edge().v1) return false;

  // Otherwise all interior vertices are contained.  The first polyline
  // vertex is contained if either the polyline model is not OPEN, or the
  // polyline forms a loop and polyline_loops_have_boundaries_ is false.
  if (polyline_contains_v0(b_edge_id, b_chain.start)) return true;
  if (v != it.b_edge().v0) return true;
  if (polyline_loops_have_boundaries_) return false;
  return v == it.b_shape().chain_edge(b_chain.chain_id,
                                      b_chain.limit - b_chain.start - 1).v1;
}